

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

void gguf_set_tensor_type(gguf_context *ctx,char *name,ggml_type type)

{
  long lVar1;
  int64_t iVar2;
  size_t sVar3;
  int64_t iVar4;
  long lVar5;
  char *fmt;
  int line;
  pointer pgVar6;
  long lVar7;
  
  iVar2 = gguf_find_tensor(ctx,name);
  if (iVar2 < 0) {
    fmt = "tensor not found: %s";
    line = 0x456;
  }
  else {
    pgVar6 = (ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = iVar2 * 0x158;
    sVar3 = ggml_type_size(type);
    iVar4 = ggml_blck_size(type);
    pgVar6[iVar2].t.type = type;
    lVar5 = pgVar6[iVar2].t.ne[0];
    if (lVar5 % iVar4 == 0) {
      pgVar6[iVar2].t.nb[0] = sVar3;
      pgVar6[iVar2].t.nb[1] = (lVar5 / iVar4) * sVar3;
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        pgVar6[iVar2].t.nb[lVar5 + 2] =
             pgVar6[iVar2].t.ne[lVar5 + 1] * pgVar6[iVar2].t.nb[lVar5 + 1];
      }
      pgVar6 = (ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(ctx->info).
                    super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pgVar6;
      while (iVar2 = iVar2 + 1, iVar2 < lVar5 / 0x158) {
        lVar1 = *(long *)((long)&pgVar6->offset + lVar7);
        sVar3 = ggml_nbytes((ggml_tensor *)((long)(pgVar6->t).ne + lVar7 + -0x10));
        pgVar6 = (ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(size_t *)((long)&pgVar6[1].offset + lVar7) =
             (-ctx->alignment & (sVar3 + ctx->alignment) - 1) + lVar1;
        lVar7 = lVar7 + 0x158;
      }
      return;
    }
    fmt = "GGML_ASSERT(%s) failed";
    name = 
    "tensor->ne[0] % blck_size == 0 && \"tensor row size not divisible by block size of new type\"";
    line = 0x45d;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",line,
             fmt,name);
}

Assistant:

void gguf_set_tensor_type(struct gguf_context * ctx, const char * name, enum ggml_type type) {
    const int64_t tensor_id = gguf_find_tensor(ctx, name);
    if (tensor_id < 0) {
        GGML_ABORT("tensor not found: %s", name);
    }
    struct ggml_tensor * tensor = &ctx->info[tensor_id].t;
    const size_t  type_size = ggml_type_size(type);
    const int64_t blck_size = ggml_blck_size(type);

    tensor->type = type;
    GGML_ASSERT(tensor->ne[0] % blck_size == 0 && "tensor row size not divisible by block size of new type");

    tensor->nb[0] = type_size;
    tensor->nb[1] = tensor->nb[0]*(tensor->ne[0]/blck_size);
    for (int i = 2; i < GGML_MAX_DIMS; i++) {
        tensor->nb[i] = tensor->nb[i - 1]*tensor->ne[i - 1];
    }

    // update offsets
    const int64_t n_tensors = gguf_get_n_tensors(ctx);
    for (int64_t i = tensor_id + 1; i < n_tensors; ++i) {
        ctx->info[i].offset = ctx->info[i - 1].offset + GGML_PAD(ggml_nbytes(&ctx->info[i - 1].t), ctx->alignment);
    }
}